

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_eb8f1::preprocessor<baryonyx::problem>::affects
          (preprocessor<baryonyx::problem> *this)

{
  pp_lifo *this_00;
  int iVar1;
  pointer ppVar2;
  int *piVar3;
  pointer piVar4;
  pp_variable_value pVar5;
  int iVar6;
  int *piVar7;
  bool value;
  int result;
  int variable;
  int factor;
  pp_variable_value top;
  int *local_60;
  int *local_58;
  int *local_50;
  _Hashtable<int,std::pair<int_const,bool>,std::allocator<std::pair<int_const,bool>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_48;
  
  this_00 = &this->lifo;
  local_48 = (_Hashtable<int,std::pair<int_const,bool>,std::allocator<std::pair<int_const,bool>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->vars;
  do {
    if ((this->lifo).data.
        super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->lifo).data.
        super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    pVar5 = pp_lifo::pop(this_00);
    top.index = pVar5.index;
    top.value = pVar5.value;
    std::
    _Hashtable<int,std::pair<int_const,bool>,std::allocator<std::pair<int_const,bool>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<int&,bool&>(local_48,&top,&top.value);
    baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>,bool>
              (this->ctx,"    - variable {} assigned to {}.\n",
               (this->pb->vars).names.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + top.index,&top.value);
    ppVar2 = (this->cache).
             super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = *(pointer *)
              ((long)&ppVar2[top.index].in_equal_constraints.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    for (piVar7 = *(int **)&ppVar2[top.index].in_equal_constraints.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl; piVar7 != piVar3;
        piVar7 = piVar7 + 1) {
      iVar1 = *piVar7;
      piVar4 = (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = piVar4[iVar1];
      if ((0 < iVar6) && (iVar6 = iVar6 + -1, piVar4[iVar1] = iVar6, iVar6 == 1)) {
        baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                  (this->ctx,"      - equal constraint {} will be removed.\n",
                   &(this->pb->equal_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar1].label);
        reduce((preprocessor<baryonyx::problem> *)&stack0xffffffffffffffc4,(constraint *)this);
        local_60 = &result;
        local_58 = &variable;
        local_50 = &factor;
        std::tuple<int&,int&,int&>::operator=
                  ((tuple<int&,int&,int&> *)&local_60,
                   (tuple<int,_int,_int> *)&stack0xffffffffffffffc4);
        if (variable < 0) {
          (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = 0;
        }
        else {
          iVar6 = variable;
          if (factor == result) {
            iVar6 = -1;
          }
          value = result != 0;
          if (value) {
            iVar6 = variable;
          }
          if (value && factor != result) {
            baryonyx::details::fail_fast
                      ("Reached","cond",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                       ,"212");
          }
          (this->equal_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = 0;
          if (-1 < iVar6) {
            pp_lifo::emplace(this_00,iVar6,value);
          }
        }
      }
    }
    ppVar2 = (this->cache).
             super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = *(pointer *)
              ((long)&ppVar2[top.index].in_greater_constraints.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    for (piVar7 = ppVar2[top.index].in_greater_constraints.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start; piVar7 != piVar3; piVar7 = piVar7 + 1) {
      iVar1 = *piVar7;
      piVar4 = (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = piVar4[iVar1];
      if ((0 < iVar6) && (iVar6 = iVar6 + -1, piVar4[iVar1] = iVar6, iVar6 == 1)) {
        baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                  (this->ctx,"      - greater constraint {} will be removed.\n",
                   &(this->pb->greater_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar1].label);
        reduce((preprocessor<baryonyx::problem> *)&stack0xffffffffffffffc4,(constraint *)this);
        local_60 = &result;
        local_58 = &variable;
        local_50 = &factor;
        std::tuple<int&,int&,int&>::operator=
                  ((tuple<int&,int&,int&> *)&local_60,
                   (tuple<int,_int,_int> *)&stack0xffffffffffffffc4);
        if (variable < 0) {
          (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = 0;
        }
        else {
          iVar6 = variable;
          if (result <= factor) {
            iVar6 = -1;
          }
          if (0 < result) {
            iVar6 = variable;
          }
          if (0 < result && factor < result) {
            baryonyx::details::fail_fast
                      ("Reached","cond",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                       ,"237");
          }
          (this->greater_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = 0;
          if (-1 < iVar6) {
            pp_lifo::emplace(this_00,iVar6,0 < result);
          }
        }
      }
    }
    ppVar2 = (this->cache).
             super__Vector_base<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = *(pointer *)
              ((long)&ppVar2[top.index].in_less_constraints.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    for (piVar7 = ppVar2[top.index].in_less_constraints.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start; piVar7 != piVar3; piVar7 = piVar7 + 1) {
      iVar1 = *piVar7;
      piVar4 = (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = piVar4[iVar1];
      if ((0 < iVar6) && (iVar6 = iVar6 + -1, piVar4[iVar1] = iVar6, iVar6 == 1)) {
        baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                  (this->ctx,"      - less constraint {} will be removed.\n",
                   &(this->pb->less_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar1].label);
        reduce((preprocessor<baryonyx::problem> *)&stack0xffffffffffffffc4,(constraint *)this);
        local_60 = &result;
        local_58 = &variable;
        local_50 = &factor;
        std::tuple<int&,int&,int&>::operator=
                  ((tuple<int&,int&,int&> *)&local_60,
                   (tuple<int,_int,_int> *)&stack0xffffffffffffffc4);
        if (variable < 0) {
          (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = 0;
        }
        else {
          iVar6 = variable;
          if (factor <= result) {
            iVar6 = -1;
          }
          if (result < 0) {
            iVar6 = variable;
          }
          if (result < 0 && result < factor) {
            baryonyx::details::fail_fast
                      ("Reached","cond",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                       ,"262");
          }
          (this->less_constraints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = 0;
          if (-1 < iVar6) {
            pp_lifo::emplace(this_00,iVar6,SUB41((uint)result >> 0x1f,0));
          }
        }
      }
    }
  } while( true );
}

Assistant:

void affects()
    {
        while (!lifo.empty()) {
            auto top = lifo.pop();
            vars.emplace(top.index, top.value);

            debug(ctx,
                  "    - variable {} assigned to {}.\n",
                  pb.vars.names[top.index],
                  top.value);

            for (int cst : cache[top.index].in_equal_constraints) {
                if (equal_constraints[cst] <= 0)
                    continue;

                --equal_constraints[cst];

                if (equal_constraints[cst] == 1) {
                    debug(ctx,
                          "      - equal constraint {} will be removed.\n",
                          pb.equal_constraints[cst].label);

                    auto v =
                      reduce_equal_constraint(pb.equal_constraints[cst]);
                    equal_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }

            for (int cst : cache[top.index].in_greater_constraints) {
                if (greater_constraints[cst] <= 0)
                    continue;

                --greater_constraints[cst];

                if (greater_constraints[cst] == 1) {
                    debug(ctx,
                          "      - greater constraint {} will be removed.\n",
                          pb.greater_constraints[cst].label);

                    auto v =
                      reduce_greater_constraint(pb.greater_constraints[cst]);
                    greater_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }

            for (int cst : cache[top.index].in_less_constraints) {
                if (less_constraints[cst] <= 0)
                    continue;

                --less_constraints[cst];

                if (less_constraints[cst] == 1) {
                    debug(ctx,
                          "      - less constraint {} will be removed.\n",
                          pb.less_constraints[cst].label);

                    auto v = reduce_less_constraint(pb.less_constraints[cst]);
                    less_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }
        }
    }